

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  InternalRunDeathTestFlag *pIVar7;
  TestEventListeners *this_00;
  TestCase *this_01;
  TimeInMillis TVar8;
  Random *this_02;
  TimeInMillis TVar9;
  UnitTestImpl *in_RDI;
  int test_index;
  TimeInMillis start;
  int i;
  bool forever;
  int repeat;
  TestEventListener *repeater;
  bool failed;
  bool has_tests_to_run;
  bool should_shard;
  bool in_subprocess_for_death_test;
  bool gtest_is_initialized_before_run_all_tests;
  ReactionToSharding in_stack_0000009c;
  UnitTestImpl *in_stack_000000a0;
  bool in_stack_0000012f;
  char *in_stack_00000130;
  char *in_stack_00000138;
  UnitTestImpl *in_stack_00000300;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar10;
  Int32 in_stack_ffffffffffffffa4;
  UnitTestImpl *in_stack_ffffffffffffffb0;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
  *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uint local_2c;
  bool local_1;
  
  bVar2 = GTestIsInitialized();
  if ((g_help_flag & 1) == 0) {
    PostFlagParsingInit((UnitTestImpl *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    WriteToShardStatusFileIfNeeded();
    pIVar7 = scoped_ptr<testing::internal::InternalRunDeathTestFlag>::get
                       (&in_RDI->internal_run_death_test_flag_);
    ShouldShard(in_stack_00000138,in_stack_00000130,in_stack_0000012f);
    iVar4 = FilterTests(in_stack_000000a0,in_stack_0000009c);
    if ((FLAGS_gtest_list_tests & 1) == 0) {
      if ((FLAGS_gtest_shuffle & 1) == 0) {
        iVar5 = 0;
      }
      else {
        iVar5 = GetRandomSeedFromFlag(in_stack_ffffffffffffffa4);
      }
      in_RDI->random_seed_ = iVar5;
      bVar1 = 0;
      this_00 = listeners(in_RDI);
      this_01 = (TestCase *)TestEventListeners::repeater(this_00);
      TVar8 = GetTimeInMillis();
      in_RDI->start_timestamp_ = TVar8;
      (*this_01->_vptr_TestCase[2])(this_01,in_RDI->parent_);
      uVar10 = FLAGS_gtest_repeat;
      if (pIVar7 != (InternalRunDeathTestFlag *)0x0) {
        uVar10 = 1;
      }
      for (local_2c = 0; (int)uVar10 < 0 || local_2c != uVar10; local_2c = local_2c + 1) {
        ClearNonAdHocTestResult((UnitTestImpl *)0x1855c1);
        TVar8 = GetTimeInMillis();
        if ((0 < iVar4) && ((FLAGS_gtest_shuffle & 1) != 0)) {
          this_02 = (Random *)random(in_RDI);
          Random::Reseed(this_02,in_RDI->random_seed_);
          ShuffleTests((UnitTestImpl *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                      );
        }
        (*this_01->_vptr_TestCase[3])(this_01,in_RDI->parent_,(ulong)local_2c);
        if (0 < iVar4) {
          (*this_01->_vptr_TestCase[4])(this_01,in_RDI->parent_);
          ForEach<std::vector<testing::Environment*,std::allocator<testing::Environment*>>,void(*)(testing::Environment*)>
                    ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                     in_stack_ffffffffffffffb0,(_func_void_Environment_ptr *)in_RDI);
          (*this_01->_vptr_TestCase[5])(this_01,in_RDI->parent_);
          bVar3 = Test::HasFatalFailure();
          if (!bVar3) {
            iVar5 = 0;
            while (in_stack_ffffffffffffffc4 = iVar5,
                  iVar6 = total_test_case_count((UnitTestImpl *)0x185687), iVar5 < iVar6) {
              GetMutableTestCase(in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20));
              TestCase::Run(this_01);
              iVar5 = in_stack_ffffffffffffffc4 + 1;
            }
          }
          (*this_01->_vptr_TestCase[0xb])(this_01,in_RDI->parent_);
          std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rbegin
                    ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                     in_RDI);
          std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>::rend
                    ((vector<testing::Environment_*,_std::allocator<testing::Environment_*>_> *)
                     in_RDI);
          __std__for_each<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>,void(*)(testing::Environment*)>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_std__reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment**,std::vector<testing::Environment*,std::allocator<testing::Environment*>>>>_void____testing__Environment____
                    ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,
                     (_func_void_Environment_ptr *)in_stack_ffffffffffffffb0);
          (*this_01->_vptr_TestCase[0xc])(this_01,in_RDI->parent_);
        }
        TVar9 = GetTimeInMillis();
        in_RDI->elapsed_time_ = TVar9 - TVar8;
        (*this_01->_vptr_TestCase[0xd])(this_01,in_RDI->parent_,(ulong)local_2c);
        bVar3 = Passed((UnitTestImpl *)0x185755);
        if (!bVar3) {
          bVar1 = 1;
        }
        UnshuffleTests(in_stack_ffffffffffffffb0);
        if ((FLAGS_gtest_shuffle & 1) != 0) {
          iVar5 = GetNextRandomSeed((int)((ulong)this_01 >> 0x20));
          in_RDI->random_seed_ = iVar5;
        }
      }
      (*this_01->_vptr_TestCase[0xe])(this_01,in_RDI->parent_);
      if (!bVar2) {
        ColoredPrintf(COLOR_RED,
                      "\nIMPORTANT NOTICE - DO NOT IGNORE:\nThis test program did NOT call testing::InitGoogleTest() before calling RUN_ALL_TESTS(). This is INVALID. Soon Google Test will start to enforce the valid usage. Please fix it ASAP, or IT WILL START TO FAIL.\n"
                     );
      }
      local_1 = (bool)(bVar1 ^ 1);
    }
    else {
      ListTestsMatchingFilter(in_stack_00000300);
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool UnitTestImpl::RunAllTests() {
  // True iff Google Test is initialized before RUN_ALL_TESTS() is called.
  const bool gtest_is_initialized_before_run_all_tests = GTestIsInitialized();

  // Do not run any test if the --help flag was specified.
  if (g_help_flag)
    return true;

  // Repeats the call to the post-flag parsing initialization in case the
  // user didn't call InitGoogleTest.
  PostFlagParsingInit();

  // Even if sharding is not on, test runners may want to use the
  // GTEST_SHARD_STATUS_FILE to query whether the test supports the sharding
  // protocol.
  internal::WriteToShardStatusFileIfNeeded();

  // True iff we are in a subprocess for running a thread-safe-style
  // death test.
  bool in_subprocess_for_death_test = false;

#if GTEST_HAS_DEATH_TEST
  in_subprocess_for_death_test = (internal_run_death_test_flag_.get() != NULL);
# if defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
  if (in_subprocess_for_death_test) {
    GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_();
  }
# endif  // defined(GTEST_EXTRA_DEATH_TEST_CHILD_SETUP_)
#endif  // GTEST_HAS_DEATH_TEST

  const bool should_shard = ShouldShard(kTestTotalShards, kTestShardIndex,
                                        in_subprocess_for_death_test);

  // Compares the full test names with the filter to decide which
  // tests to run.
  const bool has_tests_to_run = FilterTests(should_shard
                                              ? HONOR_SHARDING_PROTOCOL
                                              : IGNORE_SHARDING_PROTOCOL) > 0;

  // Lists the tests and exits if the --gtest_list_tests flag was specified.
  if (GTEST_FLAG(list_tests)) {
    // This must be called *after* FilterTests() has been called.
    ListTestsMatchingFilter();
    return true;
  }

  random_seed_ = GTEST_FLAG(shuffle) ?
      GetRandomSeedFromFlag(GTEST_FLAG(random_seed)) : 0;

  // True iff at least one test has failed.
  bool failed = false;

  TestEventListener* repeater = listeners()->repeater();

  start_timestamp_ = GetTimeInMillis();
  repeater->OnTestProgramStart(*parent_);

  // How many times to repeat the tests?  We don't want to repeat them
  // when we are inside the subprocess of a death test.
  const int repeat = in_subprocess_for_death_test ? 1 : GTEST_FLAG(repeat);
  // Repeats forever if the repeat count is negative.
  const bool forever = repeat < 0;
  for (int i = 0; forever || i != repeat; i++) {
    // We want to preserve failures generated by ad-hoc test
    // assertions executed before RUN_ALL_TESTS().
    ClearNonAdHocTestResult();

    const TimeInMillis start = GetTimeInMillis();

    // Shuffles test cases and tests if requested.
    if (has_tests_to_run && GTEST_FLAG(shuffle)) {
      random()->Reseed(random_seed_);
      // This should be done before calling OnTestIterationStart(),
      // such that a test event listener can see the actual test order
      // in the event.
      ShuffleTests();
    }

    // Tells the unit test event listeners that the tests are about to start.
    repeater->OnTestIterationStart(*parent_, i);

    // Runs each test case if there is at least one test to run.
    if (has_tests_to_run) {
      // Sets up all environments beforehand.
      repeater->OnEnvironmentsSetUpStart(*parent_);
      ForEach(environments_, SetUpEnvironment);
      repeater->OnEnvironmentsSetUpEnd(*parent_);

      // Runs the tests only if there was no fatal failure during global
      // set-up.
      if (!Test::HasFatalFailure()) {
        for (int test_index = 0; test_index < total_test_case_count();
             test_index++) {
          GetMutableTestCase(test_index)->Run();
        }
      }

      // Tears down all environments in reverse order afterwards.
      repeater->OnEnvironmentsTearDownStart(*parent_);
      std::for_each(environments_.rbegin(), environments_.rend(),
                    TearDownEnvironment);
      repeater->OnEnvironmentsTearDownEnd(*parent_);
    }

    elapsed_time_ = GetTimeInMillis() - start;

    // Tells the unit test event listener that the tests have just finished.
    repeater->OnTestIterationEnd(*parent_, i);

    // Gets the result and clears it.
    if (!Passed()) {
      failed = true;
    }

    // Restores the original test order after the iteration.  This
    // allows the user to quickly repro a failure that happens in the
    // N-th iteration without repeating the first (N - 1) iterations.
    // This is not enclosed in "if (GTEST_FLAG(shuffle)) { ... }", in
    // case the user somehow changes the value of the flag somewhere
    // (it's always safe to unshuffle the tests).
    UnshuffleTests();

    if (GTEST_FLAG(shuffle)) {
      // Picks a new random seed for each iteration.
      random_seed_ = GetNextRandomSeed(random_seed_);
    }
  }

  repeater->OnTestProgramEnd(*parent_);

  if (!gtest_is_initialized_before_run_all_tests) {
    ColoredPrintf(
        COLOR_RED,
        "\nIMPORTANT NOTICE - DO NOT IGNORE:\n"
        "This test program did NOT call " GTEST_INIT_GOOGLE_TEST_NAME_
        "() before calling RUN_ALL_TESTS(). This is INVALID. Soon " GTEST_NAME_
        " will start to enforce the valid usage. "
        "Please fix it ASAP, or IT WILL START TO FAIL.\n");  // NOLINT
#if GTEST_FOR_GOOGLE_
    ColoredPrintf(COLOR_RED,
                  "For more details, see http://wiki/Main/ValidGUnitMain.\n");
#endif  // GTEST_FOR_GOOGLE_
  }

  return !failed;
}